

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_smooth_h_predictor_32x16_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ushort uVar1;
  long lVar2;
  int c;
  long lVar3;
  
  uVar1 = above[0x1f];
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      dst[lVar3] = (uint16_t)
                   ((uint)left[lVar2] * (uint)smooth_weights[lVar3 + 0x1c] +
                    (uint)(byte)-smooth_weights[lVar3 + 0x1c] * (uint)uVar1 + 0x80 >> 8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    lVar2 = lVar2 + 1;
    dst = dst + stride;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

static inline void highbd_smooth_h_predictor(uint16_t *dst, ptrdiff_t stride,
                                             int bw, int bh,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  (void)bd;
  const uint16_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights = smooth_weights + bw - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint16_t pixels[] = { left[r], right_pred };
      const uint8_t weights[] = { sm_weights[c], scale - sm_weights[c] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[c]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}